

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdafx.h
# Opt level: O0

FunctionValue * NULLC::construct<FunctionValue>(int count)

{
  FunctionValue *pFVar1;
  FunctionValue *local_30;
  void *tmp;
  int count_local;
  
  pFVar1 = (FunctionValue *)(*(code *)alloc)(count * 0x18 + 4);
  if ((long)count != 0) {
    local_30 = pFVar1;
    do {
      FunctionValue::FunctionValue(local_30);
      local_30 = local_30 + 1;
    } while (local_30 != pFVar1 + count);
  }
  return pFVar1;
}

Assistant:

static T*		construct(int count)
	{
		void *tmp = (void*)alloc(4 + count * sizeof(T));
		new(tmp) T[count];
		return (T*)tmp;
	}